

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_flats.cpp
# Opt level: O3

void __thiscall GLFlat::DrawSubsector(GLFlat *this,subsector_t *sub)

{
  float fVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  seg_t *psVar5;
  vertex_t *pvVar6;
  FFlatVertexBuffer *pFVar7;
  FFlatVertex *pFVar8;
  double *pdVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  DWORD DVar14;
  long lVar15;
  float *pfVar16;
  FFlatVertex *pFVar17;
  uint uVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar29;
  uint vi [4];
  FQuadDrawer qd;
  uint local_68 [4];
  FQuadDrawer local_58;
  int local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if (gl.buffermethod == 1) {
    local_58.p = FQuadDrawer::buffer;
    local_68[0] = 0;
    DVar14 = sub->numlines;
    uVar4 = DVar14 - 1;
    if (1 < uVar4) {
      uVar18 = 1;
      iVar19 = 2;
      iVar29 = -0x80000000;
      local_48 = -0x80000000;
      uStack_44 = 0x80000000;
      uStack_40 = 0x80000000;
      uStack_3c = 0x80000000;
      auVar27 = _DAT_0073b2f0;
      auVar28 = _DAT_0073b300;
      do {
        if (uVar18 < DVar14 - 3) {
          auVar20._4_4_ = uVar4;
          auVar20._0_4_ = uVar4;
          auVar20._8_8_ = 0;
          auVar21 = auVar20 ^ auVar28;
          lVar15 = 0;
          do {
            iVar22 = (int)lVar15;
            auVar23._8_4_ = iVar22;
            auVar23._0_8_ = lVar15;
            auVar23._12_4_ = (int)((ulong)lVar15 >> 0x20);
            auVar23 = (auVar23 | auVar27) ^ auVar28;
            auVar25._4_4_ = iVar19 + 1 + iVar22;
            auVar25._0_4_ = iVar19 + iVar22;
            auVar25._8_8_ = 0;
            auVar26 = auVar25 ^ auVar28;
            auVar24._0_4_ = -(uint)(auVar26._0_4_ < auVar21._0_4_);
            auVar24._4_4_ = -(uint)(auVar26._4_4_ < auVar21._4_4_);
            auVar24._8_4_ = -(uint)(auVar26._8_4_ < auVar21._8_4_);
            auVar24._12_4_ = -(uint)(auVar26._12_4_ < auVar21._12_4_);
            auVar24 = ~auVar24 & auVar20 | auVar25 & auVar24;
            if (auVar23._4_4_ == iVar29 && auVar23._0_4_ < -0x7ffffffd) {
              local_68[lVar15 + 1] = auVar24._0_4_;
              local_68[lVar15 + 2] = auVar24._4_4_;
            }
            lVar15 = lVar15 + 2;
          } while (lVar15 != 4);
          psVar5 = sub->firstline;
          dVar2 = (this->plane).plane.D;
          dVar10 = (this->plane).plane.normal.X;
          dVar11 = (this->plane).plane.normal.Y;
          fVar1 = this->dz;
          dVar3 = (this->plane).plane.negiC;
          pfVar16 = &(local_58.p)->v;
          lVar15 = 0;
          do {
            pvVar6 = psVar5[local_68[lVar15]].v1;
            dVar12 = (pvVar6->p).X;
            dVar13 = (pvVar6->p).Y;
            ((FFlatVertex *)(pfVar16 + -4))->x = (float)dVar12;
            ((FFlatVertex *)(pfVar16 + -4))->z =
                 (float)((dVar13 * dVar11 + dVar12 * dVar10 + dVar2) * dVar3 + (double)fVar1);
            *(ulong *)(pfVar16 + -2) = CONCAT44((float)(dVar12 * 0.015625),(float)dVar13);
            *pfVar16 = (float)(dVar13 * -0.015625);
            lVar15 = lVar15 + 1;
            pfVar16 = pfVar16 + 5;
          } while (lVar15 != 4);
          if (gl.buffermethod == 1) {
            FQuadDrawer::DoRender(&local_58,6);
            auVar27 = _DAT_0073b2f0;
            auVar28 = _DAT_0073b300;
            iVar29 = local_48;
          }
          else {
            (*_ptrc_glDrawArrays)(6,local_58.ndx,4);
            auVar27 = _DAT_0073b2f0;
            auVar28 = _DAT_0073b300;
            iVar29 = local_48;
          }
        }
        uVar18 = uVar18 + 2;
        DVar14 = sub->numlines;
        uVar4 = DVar14 - 1;
        iVar19 = iVar19 + 2;
      } while (uVar18 < uVar4);
    }
  }
  else {
    pFVar7 = GLRenderer->mVBO;
    pFVar8 = pFVar7->map;
    uVar4 = pFVar7->mCurIndex;
    pFVar17 = pFVar8 + uVar4;
    uVar18 = sub->numlines;
    if ((ulong)uVar18 != 0) {
      psVar5 = sub->firstline;
      dVar2 = (this->plane).plane.D;
      dVar10 = (this->plane).plane.normal.X;
      dVar11 = (this->plane).plane.normal.Y;
      dVar3 = (this->plane).plane.negiC;
      fVar1 = this->dz;
      lVar15 = 0;
      do {
        pdVar9 = *(double **)((long)&psVar5->v1 + lVar15);
        dVar12 = *pdVar9;
        dVar13 = pdVar9[1];
        pFVar17->x = (float)dVar12;
        pFVar17->z = (float)((dVar13 * dVar11 + dVar12 * dVar10 + dVar2) * dVar3 + (double)fVar1);
        pFVar17->y = (float)dVar13;
        pFVar17->u = (float)(dVar12 * 0.015625);
        pFVar17->v = (float)(dVar13 * -0.015625);
        pFVar17 = pFVar17 + 1;
        lVar15 = lVar15 + 0x48;
      } while ((ulong)uVar18 * 0x48 != lVar15);
    }
    uVar18 = (int)((ulong)((long)pFVar17 - (long)pFVar8) >> 2) * -0x33333333;
    pFVar7->mCurIndex = uVar18;
    if (0x1e828b < uVar18) {
      pFVar7->mCurIndex = pFVar7->mIndex;
    }
    (*_ptrc_glDrawArrays)(6,uVar4,uVar18 - uVar4);
    DVar14 = sub->numlines;
  }
  flatvertices = flatvertices + DVar14;
  flatprimitives = flatprimitives + 1;
  return;
}

Assistant:

void GLFlat::DrawSubsector(subsector_t * sub)
{
	if (gl.buffermethod != BM_DEFERRED)
	{
		FFlatVertex *ptr = GLRenderer->mVBO->GetBuffer();
		for (unsigned int k = 0; k < sub->numlines; k++)
		{
			vertex_t *vt = sub->firstline[k].v1;
			ptr->x = vt->fX();
			ptr->z = plane.plane.ZatPoint(vt) + dz;
			ptr->y = vt->fY();
			ptr->u = vt->fX() / 64.f;
			ptr->v = -vt->fY() / 64.f;
			ptr++;
		}
		GLRenderer->mVBO->RenderCurrent(ptr, GL_TRIANGLE_FAN);
	}
	else
	{
		// if we cannot access the buffer, use the quad drawer as fallback by splitting the subsector into quads.
		// Trying to get this into the vertex buffer in the processing pass is too costly and this is only used for render hacks.
		FQuadDrawer qd;
		unsigned int vi[4];

		vi[0] = 0;
		for (unsigned int i = 1; i < sub->numlines-1; i += 2)
		{
			if (i < sub->numlines - 3)
			{
				for (unsigned int j = 1; j < 4; j++)
				{
					vi[j] = MIN(i + j, sub->numlines - 1);
				}
				for (unsigned int x = 0; x < 4; x++)
				{
					vertex_t *vt = sub->firstline[vi[x]].v1;
					qd.Set(x, vt->fX(), plane.plane.ZatPoint(vt) + dz, vt->fY(), vt->fX() / 64.f, -vt->fY() / 64.f);
				}
				qd.Render(GL_TRIANGLE_FAN);
			}
		}
	}

	flatvertices += sub->numlines;
	flatprimitives++;
}